

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateObjectTypedef
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  GeneratorOptions *extraout_RDX_01;
  long lVar1;
  long lVar2;
  string type_name;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  std::operator+(&local_50,&local_70,".ObjectFormat");
  std::__cxx11::string::~string((string *)&local_70);
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)desc;
  io::Printer::Print<char[12],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,
             "/**\n * The raw object form of $messageName$ as accepted by the `fromObject` method.\n * @record\n */\n$typeName$ = function() {\n"
             ,(char (*) [12])"messageName",args_1,(char (*) [9])"typeName",&local_50);
  lVar2 = 0;
  options_00 = extraout_RDX;
  for (lVar1 = 0; lVar1 < *(int *)(desc + 0x68); lVar1 = lVar1 + 1) {
    if (lVar2 != 0) {
      io::Printer::Print<>(printer,"\n");
      options_00 = extraout_RDX_00;
    }
    (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)(*(long *)(desc + 0x28) + lVar2),options_00,
               (FieldDescriptor *)args_1);
    args_1 = &local_70;
    io::Printer::Print<char[10],std::__cxx11::string,char[10],char[2]>
              (printer,"  /** @type {$fieldType$|undefined} */\n  this.$fieldName$;\n",
               (char (*) [10])"fieldName",&local_70,(char (*) [10])"fieldType",
               (char (*) [2])0x38e073);
    std::__cxx11::string::~string((string *)&local_70);
    lVar2 = lVar2 + 0x98;
    options_00 = extraout_RDX_01;
  }
  io::Printer::Print<>(printer,"};\n\n");
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void Generator::GenerateObjectTypedef(const GeneratorOptions& options,
                                      io::Printer* printer,
                                      const Descriptor* desc) const {
  // TODO(b/122687752): Consider renaming nested messages called ObjectFormat
  //     to prevent collisions.
  const std::string type_name = GetMessagePath(options, desc) + ".ObjectFormat";

  printer->Print(
      "/**\n"
      " * The raw object form of $messageName$ as accepted by the `fromObject` "
      "method.\n"
      " * @record\n"
      " */\n"
      "$typeName$ = function() {\n",
      "messageName", desc->name(), "typeName", type_name);

  for (int i = 0; i < desc->field_count(); i++) {
    if (i > 0) {
      printer->Print("\n");
    }
    printer->Print(
        "  /** @type {$fieldType$|undefined} */\n"
        "  this.$fieldName$;\n",
        "fieldName", JSObjectFieldName(options, desc->field(i)),
        // TODO(b/121097361): Add type checking for field values.
        "fieldType", "?");
  }

  printer->Print("};\n\n");
}